

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_1bf255::TargetTask::start(TargetTask *this,TaskInterface ti)

{
  pointer ppNVar1;
  StringRef str;
  uintptr_t inputID;
  pointer ppNVar2;
  BuildKey local_80;
  TaskInterface local_60;
  long *local_50 [2];
  long local_40 [2];
  
  local_60.ctx = ti.ctx;
  local_60.impl = ti.impl;
  ppNVar2 = (this->target->nodes).
            super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppNVar1 = (this->target->nodes).
            super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppNVar2 != ppNVar1) {
    inputID = 0;
    do {
      str.Data = ((*ppNVar2)->name)._M_dataplus._M_p;
      str.Length = ((*ppNVar2)->name)._M_string_length;
      llbuild::buildsystem::BuildKey::BuildKey(&local_80,'N',str);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,local_80.key.key._M_dataplus._M_p,
                 local_80.key.key._M_dataplus._M_p + local_80.key.key._M_string_length);
      llbuild::core::TaskInterface::request(&local_60,(KeyType *)local_50,inputID);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.key.key._M_dataplus._M_p != &local_80.key.key.field_2) {
        operator_delete(local_80.key.key._M_dataplus._M_p,
                        local_80.key.key.field_2._M_allocated_capacity + 1);
      }
      ppNVar2 = ppNVar2 + 1;
      inputID = (uintptr_t)((int)inputID + 1);
    } while (ppNVar2 != ppNVar1);
  }
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // Request all of the necessary system tasks.
    unsigned id = 0;
    for (auto it = target.getNodes().begin(),
           ie = target.getNodes().end(); it != ie; ++it, ++id) {
      ti.request(BuildKey::makeNode(*it).toData(), id);
    }
  }